

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O1

void __thiscall kj::_::Mutex::unlock(Mutex *this,Exclusivity exclusivity)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Waiter *pWVar5;
  Waiter *pWVar6;
  char cVar7;
  bool bVar8;
  
  if (exclusivity == SHARED) {
    LOCK();
    uVar2 = this->futex;
    this->futex = this->futex - 1;
    UNLOCK();
    if (uVar2 != 0x40000001) {
      return;
    }
    LOCK();
    bVar8 = this->futex == 0x40000000;
    if (bVar8) {
      this->futex = 0;
    }
    UNLOCK();
    if (!bVar8) {
      return;
    }
  }
  else {
    if (exclusivity != EXCLUSIVE) {
      return;
    }
    pWVar5 = (this->waitersHead).ptr;
    do {
      if (pWVar5 == (Waiter *)0x0) {
        cVar7 = '\x05';
        pWVar6 = pWVar5;
      }
      else {
        pWVar6 = (pWVar5->next).ptr;
        iVar3 = (**pWVar5->predicate->_vptr_Predicate)();
        cVar7 = (char)iVar3 != '\0';
        if ((bool)cVar7) {
          pWVar5->futex = 1;
          syscall(0xca,&pWVar5->futex,0x81,0x7fffffff,0,0,0);
        }
      }
      pWVar5 = pWVar6;
    } while (cVar7 == '\0');
    if (cVar7 != '\x05') {
      return;
    }
    uVar4 = this->futex;
    do {
      LOCK();
      uVar1 = this->futex;
      bVar8 = uVar4 == uVar1;
      if (bVar8) {
        this->futex = uVar4 & 0x3fffffff;
        uVar1 = uVar4;
      }
      uVar4 = uVar1;
      UNLOCK();
    } while (!bVar8);
    if ((uVar4 & 0x7fffffff) == 0) {
      return;
    }
  }
  syscall(0xca,this,0x81,0x7fffffff,0,0,0);
  return;
}

Assistant:

void Mutex::unlock(Exclusivity exclusivity) {
  switch (exclusivity) {
    case EXCLUSIVE: {
      KJ_DASSERT(futex & EXCLUSIVE_HELD, "Unlocked a mutex that wasn't locked.");

      // First check if there are any conditional waiters. Note we only do this when unlocking an
      // exclusive lock since under a shared lock the state couldn't have changed.
      auto nextWaiter = waitersHead;
      for (;;) {
        KJ_IF_MAYBE(waiter, nextWaiter) {
          nextWaiter = waiter->next;

          if (waiter->predicate.check()) {
            // This waiter's predicate now evaluates true, so wake it up.
            __atomic_store_n(&waiter->futex, 1, __ATOMIC_RELEASE);
            syscall(SYS_futex, &waiter->futex, FUTEX_WAKE_PRIVATE, INT_MAX, NULL, NULL, 0);

            // We transferred ownership of the lock to this waiter, so we're done now.
            return;
          }
        } else {
          // No more waiters.
          break;
        }
      }

      // Didn't wake any waiters, so wake normally.
      uint oldState = __atomic_fetch_and(
          &futex, ~(EXCLUSIVE_HELD | EXCLUSIVE_REQUESTED), __ATOMIC_RELEASE);

      if (KJ_UNLIKELY(oldState & ~EXCLUSIVE_HELD)) {
        // Other threads are waiting.  If there are any shared waiters, they now collectively hold
        // the lock, and we must wake them up.  If there are any exclusive waiters, we must wake
        // them up even if readers are waiting so that at the very least they may re-establish the
        // EXCLUSIVE_REQUESTED bit that we just removed.
        syscall(SYS_futex, &futex, FUTEX_WAKE_PRIVATE, INT_MAX, NULL, NULL, 0);
      }
      break;
    }

    case SHARED: {
      KJ_DASSERT(futex & SHARED_COUNT_MASK, "Unshared a mutex that wasn't shared.");
      uint state = __atomic_sub_fetch(&futex, 1, __ATOMIC_RELEASE);

      // The only case where anyone is waiting is if EXCLUSIVE_REQUESTED is set, and the only time
      // it makes sense to wake up that waiter is if the shared count has reached zero.
      if (KJ_UNLIKELY(state == EXCLUSIVE_REQUESTED)) {
        if (__atomic_compare_exchange_n(
            &futex, &state, 0, false, __ATOMIC_RELAXED, __ATOMIC_RELAXED)) {
          // Wake all exclusive waiters.  We have to wake all of them because one of them will
          // grab the lock while the others will re-establish the exclusive-requested bit.
          syscall(SYS_futex, &futex, FUTEX_WAKE_PRIVATE, INT_MAX, NULL, NULL, 0);
        }
      }
      break;
    }
  }